

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

hash_entry_t * lookup(hash_table_t *h,uint32 hash,char *key,size_t len)

{
  int32 iVar1;
  bool bVar2;
  hash_entry_t *local_38;
  hash_entry_t *entry;
  size_t len_local;
  char *key_local;
  uint32 hash_local;
  hash_table_t *h_local;
  
  local_38 = h->table + hash;
  if (local_38->key == (char *)0x0) {
    h_local = (hash_table_t *)0x0;
  }
  else {
    if (h->nocase == 0) {
      while( true ) {
        bVar2 = false;
        if ((local_38 != (hash_entry_t *)0x0) && (bVar2 = true, local_38->len == len)) {
          iVar1 = keycmp_case(local_38,key);
          bVar2 = iVar1 != 0;
        }
        if (!bVar2) break;
        local_38 = local_38->next;
      }
    }
    else {
      while( true ) {
        bVar2 = false;
        if ((local_38 != (hash_entry_t *)0x0) && (bVar2 = true, local_38->len == len)) {
          iVar1 = keycmp_nocase(local_38,key);
          bVar2 = iVar1 != 0;
        }
        if (!bVar2) break;
        local_38 = local_38->next;
      }
    }
    h_local = (hash_table_t *)local_38;
  }
  return (hash_entry_t *)h_local;
}

Assistant:

static hash_entry_t *
lookup(hash_table_t * h, uint32 hash, const char *key, size_t len)
{
    hash_entry_t *entry;

    entry = &(h->table[hash]);
    if (entry->key == NULL)
        return NULL;

    if (h->nocase) {
        while (entry && ((entry->len != len)
                         || (keycmp_nocase(entry, key) != 0)))
            entry = entry->next;
    }
    else {
        while (entry && ((entry->len != len)
                         || (keycmp_case(entry, key) != 0)))
            entry = entry->next;
    }

    return entry;
}